

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

apprun_env_item_t * apprun_env_item_export(apprun_env_item_t *item)

{
  _Bool _Var1;
  char *pcVar2;
  apprun_env_item_t *copy;
  apprun_env_item_t *item_local;
  
  _Var1 = apprun_env_item_is_tracked(item);
  if (_Var1) {
    _Var1 = apprun_env_item_is_changed(item);
    if (_Var1) {
      item_local = apprun_env_item_changed_export(item);
    }
    else {
      item_local = apprun_env_item_unchanged_export(item);
    }
  }
  else if (item->current_value == (char *)0x0) {
    item_local = (apprun_env_item_t *)0x0;
  }
  else {
    item_local = (apprun_env_item_t *)calloc(1,0x20);
    pcVar2 = strdup(item->name);
    item_local->name = pcVar2;
    pcVar2 = strdup(item->current_value);
    item_local->current_value = pcVar2;
  }
  return item_local;
}

Assistant:

apprun_env_item_t *apprun_env_item_export(apprun_env_item_t *item) {
    if (!apprun_env_item_is_tracked(item)) {
        if (item->current_value == NULL)
            return NULL;

        apprun_env_item_t *copy = calloc(1, sizeof(apprun_env_item_t));
        copy->name = strdup(item->name);
        copy->current_value = strdup(item->current_value);

        return copy;
    }

    if (apprun_env_item_is_changed(item))
        return apprun_env_item_changed_export(item);
    else
        return apprun_env_item_unchanged_export(item);
}